

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Block.cpp
# Opt level: O3

void __thiscall
ninx::parser::element::Block::set_function
          (Block *this,string *name,
          unique_ptr<ninx::parser::element::FunctionDefinition,_std::default_delete<ninx::parser::element::FunctionDefinition>_>
          *func)

{
  FunctionDefinition *pFVar1;
  FunctionDefinition *pFVar2;
  mapped_type *pmVar3;
  
  pmVar3 = std::__detail::
           _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<ninx::parser::element::FunctionDefinition,_std::default_delete<ninx::parser::element::FunctionDefinition>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<ninx::parser::element::FunctionDefinition,_std::default_delete<ninx::parser::element::FunctionDefinition>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
           ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<ninx::parser::element::FunctionDefinition,_std::default_delete<ninx::parser::element::FunctionDefinition>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<ninx::parser::element::FunctionDefinition,_std::default_delete<ninx::parser::element::FunctionDefinition>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                         *)&this->functions,name);
  pFVar1 = (func->_M_t).
           super___uniq_ptr_impl<ninx::parser::element::FunctionDefinition,_std::default_delete<ninx::parser::element::FunctionDefinition>_>
           ._M_t.
           super__Tuple_impl<0UL,_ninx::parser::element::FunctionDefinition_*,_std::default_delete<ninx::parser::element::FunctionDefinition>_>
           .super__Head_base<0UL,_ninx::parser::element::FunctionDefinition_*,_false>._M_head_impl;
  (func->_M_t).
  super___uniq_ptr_impl<ninx::parser::element::FunctionDefinition,_std::default_delete<ninx::parser::element::FunctionDefinition>_>
  ._M_t.
  super__Tuple_impl<0UL,_ninx::parser::element::FunctionDefinition_*,_std::default_delete<ninx::parser::element::FunctionDefinition>_>
  .super__Head_base<0UL,_ninx::parser::element::FunctionDefinition_*,_false>._M_head_impl =
       (FunctionDefinition *)0x0;
  pFVar2 = (pmVar3->_M_t).
           super___uniq_ptr_impl<ninx::parser::element::FunctionDefinition,_std::default_delete<ninx::parser::element::FunctionDefinition>_>
           ._M_t.
           super__Tuple_impl<0UL,_ninx::parser::element::FunctionDefinition_*,_std::default_delete<ninx::parser::element::FunctionDefinition>_>
           .super__Head_base<0UL,_ninx::parser::element::FunctionDefinition_*,_false>._M_head_impl;
  (pmVar3->_M_t).
  super___uniq_ptr_impl<ninx::parser::element::FunctionDefinition,_std::default_delete<ninx::parser::element::FunctionDefinition>_>
  ._M_t.
  super__Tuple_impl<0UL,_ninx::parser::element::FunctionDefinition_*,_std::default_delete<ninx::parser::element::FunctionDefinition>_>
  .super__Head_base<0UL,_ninx::parser::element::FunctionDefinition_*,_false>._M_head_impl = pFVar1;
  if (pFVar2 != (FunctionDefinition *)0x0) {
    (**(code **)(*(long *)&(pFVar2->super_Statement).super_ASTElement + 8))();
    return;
  }
  return;
}

Assistant:

void ninx::parser::element::Block::set_function(const std::string &name,
                                                std::unique_ptr<ninx::parser::element::FunctionDefinition> func) {
    this->functions[name] = std::move(func);
}